

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GetScalarFieldOfStruct
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  string getter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  GenGetter_abi_cxx11_(&local_40,this,&(field->value).type);
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&local_80,&this->namer_,field);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator+(&local_80,"(self): return ",&local_40);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::append((char *)code_ptr);
  NumToString<unsigned_short>(&local_60,(field->value).offset);
  std::operator+(&local_80,&local_60,"))\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void GetScalarFieldOfStruct(const StructDef &struct_def,
                              const FieldDef &field,
                              std::string *code_ptr) const {
    auto &code = *code_ptr;
    std::string getter = GenGetter(field.value.type);
    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field);
    code += "(self): return " + getter;
    code += "self._tab.Pos + flatbuffers.number_types.UOffsetTFlags.py_type(";
    code += NumToString(field.value.offset) + "))\n";
  }